

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
irwincolor::Map::map
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Map *this,
          double y)

{
  string *psVar1;
  float fVar2;
  pointer pdVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  value_type_conflict1 *__val;
  pointer puVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  pointer pdVar11;
  long lVar12;
  value_type_conflict3 *__val_3;
  ulong uVar13;
  uint uVar14;
  pointer pfVar15;
  uint uVar16;
  value_type_conflict3 *__val_2;
  pointer pfVar17;
  value_type_conflict3 *__val_1;
  undefined4 uVar18;
  undefined4 uVar19;
  float fVar20;
  double dVar21;
  vector<float,_std::allocator<float>_> rgb0;
  vector<float,_std::allocator<float>_> rgb1;
  vector<float,_std::allocator<float>_> hsv0;
  vector<float,_std::allocator<float>_> hsv1;
  vector<float,_std::allocator<float>_> rgbf;
  vector<float,_std::allocator<float>_> hsv;
  vector<float,_std::allocator<float>_> local_d8;
  double local_c0;
  vector<float,_std::allocator<float>_> local_b8;
  vector<float,_std::allocator<float>_> local_98;
  vector<float,_std::allocator<float>_> local_80;
  float *local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = y;
  puVar7 = (pointer)operator_new(3);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = puVar7;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = puVar7;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar7 + 3;
  *puVar7 = '\0';
  puVar7[1] = '\0';
  puVar7[2] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = puVar7 + 3;
  if (1.0 < local_c0) {
    *puVar7 = (uchar)(int)(this->nanr * 255.99899291992188);
    puVar7[1] = (uchar)(int)(this->nang * 255.99899291992188);
    dVar21 = this->nanb;
LAB_0010992b:
    puVar7[2] = (uchar)(int)(dVar21 * 255.99899291992188);
    return __return_storage_ptr__;
  }
  dVar21 = 0.0;
  if (0.0 <= local_c0) {
    dVar21 = local_c0;
  }
  uVar18 = 0;
  uVar19 = 0x3ff00000;
  if (dVar21 <= 1.0) {
    uVar18 = SUB84(dVar21,0);
    uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
  }
  local_c0 = (double)CONCAT44(uVar19,uVar18);
  if (this->inv != false) {
    local_c0 = 1.0 - (double)CONCAT44(uVar19,uVar18);
  }
  if (this->paraView != true) {
    uVar14 = this->imap;
    if ((ulong)uVar14 < 3) {
      puVar7[uVar14] = (uchar)(int)(local_c0 * 255.99899291992188);
      return __return_storage_ptr__;
    }
    if (uVar14 - 3 < 3) {
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT53(local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start._3_5_,0xffffff);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 &local_d8);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[(long)this->imap + -3] =
           (uchar)(int)(local_c0 * 255.99899291992188);
      return __return_storage_ptr__;
    }
    local_c0 = local_c0 * 6.0;
    dVar21 = fmod(local_c0,2.0);
    bVar5 = (byte)(int)((1.0 - ABS(dVar21 + -1.0)) * 255.99899291992188);
    if (local_c0 < 1.0) {
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_2_ = CONCAT11(bVar5,0xff);
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_3_ =
           (uint3)(ushort)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 &local_d8);
      return __return_storage_ptr__;
    }
    if (local_c0 < 2.0) {
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_3_ = CONCAT21(0xff,bVar5);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 &local_d8);
      return __return_storage_ptr__;
    }
    if (local_c0 < 3.0) {
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_3_ = CONCAT12(bVar5,0xff00);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 &local_d8);
      return __return_storage_ptr__;
    }
    if (local_c0 < 4.0) {
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_2_ = (ushort)bVar5 << 8;
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_3_ =
           CONCAT12(0xff,(ushort)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 &local_d8);
      return __return_storage_ptr__;
    }
    if (local_c0 < 5.0) {
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_3_ = CONCAT21(0xff00,bVar5);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 &local_d8);
      return __return_storage_ptr__;
    }
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_3_ = CONCAT12(bVar5,0xff);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               &local_d8);
    return __return_storage_ptr__;
  }
  pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar11 = pdVar3;
  uVar13 = (long)(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
  while (uVar4 = uVar13, 0 < (long)uVar4) {
    uVar13 = uVar4 >> 1;
    if (pdVar11[uVar13] <= local_c0 && local_c0 != pdVar11[uVar13]) {
      pdVar11 = pdVar11 + uVar13 + 1;
      uVar13 = ~uVar13 + uVar4;
    }
  }
  uVar14 = (uint)((long)pdVar11 - (long)pdVar3 >> 3);
  if ((int)uVar14 < 1) {
    lVar12 = ((long)pdVar11 - (long)pdVar3) * 0x20000000 >> 0x1d;
    *puVar7 = (uchar)(int)(*(double *)
                            ((long)(this->r).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar12) *
                          255.99899291992188);
    puVar7[1] = (uchar)(int)(*(double *)
                              ((long)(this->g).super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar12) *
                            255.99899291992188);
    dVar21 = *(double *)
              ((long)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar12);
    goto LAB_0010992b;
  }
  uVar16 = uVar14 - 1;
  uVar14 = uVar14 & 0x7fffffff;
  local_c0 = (local_c0 - pdVar3[uVar16]) / (pdVar3[uVar14] - pdVar3[uVar16]);
  psVar1 = &this->space;
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar6 == 0) {
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0xc);
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 3;
    *local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = 0.0;
    *local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start = (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = (float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar16];
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar16];
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (float *)operator_new(0xc);
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar8 + 3;
    *pfVar8 = 0.0;
    pfVar8[1] = 0.0;
    pfVar8[2] = 0.0;
    *pfVar8 = (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
    pfVar8[1] = (float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
    pfVar8[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar8;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    rgb2msh(&local_98,&local_d8);
    rgb2msh(&local_80,&local_b8);
    fVar2 = local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[2];
    fVar20 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[2];
    if (pi < (double)ABS(fVar2 - fVar20)) {
      pfVar9 = local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (fVar20 < fVar2) {
        pfVar9 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (fVar2 <= fVar20) {
        fVar20 = fVar2;
      }
      pfVar9[2] = (float)(pi + pi + (double)fVar20);
    }
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pfVar9 = (float *)operator_new(0xc);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar9 + 3;
    *pfVar9 = 0.0;
    pfVar9[1] = 0.0;
    pfVar9[2] = 0.0;
    dVar21 = 1.0 - local_c0;
    *pfVar9 = (float)((double)*local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start * dVar21 +
                     (double)*local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start * local_c0);
    pfVar9[1] = (float)((double)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[1] * dVar21 +
                       (double)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[1] * local_c0);
    pfVar9[2] = (float)((double)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[2] * dVar21 +
                       (double)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[2] * local_c0);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar9;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    msh2rgb(&local_60,&local_48);
    *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
     _M_impl.super__Vector_impl_data._M_start =
         (uchar)(int)(*local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start * 255.999);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[1] =
         (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[1] * 255.999);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[2] =
         (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[2] * 255.999);
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    operator_delete(pfVar9,0xc);
    operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    operator_delete(pfVar8,0xc);
    if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start == (float *)0x0) {
      return __return_storage_ptr__;
    }
    uVar13 = (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
    pfVar8 = local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    goto LAB_0010a413;
  }
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar6 == 0) {
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pfVar8 = (float *)operator_new(0xc);
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar8 + 3;
    *pfVar8 = 0.0;
    pfVar8[1] = 0.0;
    pfVar8[2] = 0.0;
    *pfVar8 = (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
    pfVar8[1] = (float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
    pfVar8[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar8;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar9 = (float *)operator_new(0xc);
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar9 + 3;
    *pfVar9 = 0.0;
    pfVar9[1] = 0.0;
    pfVar9[2] = 0.0;
    *pfVar9 = (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
    pfVar9[1] = (float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
    pfVar9[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar9;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_68 = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
    rgb2lab(&local_98,&local_d8);
    rgb2lab(&local_80,&local_b8);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pfVar10 = (float *)operator_new(0xc);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar10 + 3;
    *pfVar10 = 0.0;
    pfVar10[1] = 0.0;
    pfVar10[2] = 0.0;
    dVar21 = 1.0 - local_c0;
    *pfVar10 = (float)((double)*local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start * dVar21 +
                      (double)*local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start * local_c0);
    pfVar10[1] = (float)((double)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[1] * dVar21 +
                        (double)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[1] * local_c0);
    pfVar10[2] = (float)((double)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[2] * dVar21 +
                        (double)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[2] * local_c0);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar10;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    lab2rgb(&local_60,&local_48);
    *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
     _M_impl.super__Vector_impl_data._M_start =
         (uchar)(int)(*local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start * 255.999);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[1] =
         (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[1] * 255.999);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[2] =
         (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[2] * 255.999);
    pfVar15 = local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar17 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
LAB_0010a3c1:
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 != 0) {
      dVar21 = 1.0 - local_c0;
      pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_start =
           (uchar)(int)((pdVar3[uVar16] * dVar21 + pdVar3[uVar14] * local_c0) * 255.99899291992188);
      pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[1] =
           (uchar)(int)((pdVar3[uVar16] * dVar21 + pdVar3[uVar14] * local_c0) * 255.99899291992188);
      pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[2] =
           (uchar)(int)((dVar21 * pdVar3[uVar16] + local_c0 * pdVar3[uVar14]) * 255.99899291992188);
      return __return_storage_ptr__;
    }
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pfVar8 = (float *)operator_new(0xc);
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar8 + 3;
    *pfVar8 = 0.0;
    pfVar8[1] = 0.0;
    pfVar8[2] = 0.0;
    *pfVar8 = (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
    pfVar8[1] = (float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
    pfVar8[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar8;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar9 = (float *)operator_new(0xc);
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar9 + 3;
    *pfVar9 = 0.0;
    pfVar9[1] = 0.0;
    pfVar9[2] = 0.0;
    *pfVar9 = (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
    pfVar9[1] = (float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
    pfVar9[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar9;
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_68 = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
    rgb2hsv(&local_98,&local_d8);
    rgb2hsv(&local_80,&local_b8);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pfVar10 = (float *)operator_new(0xc);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar10 + 3;
    *pfVar10 = 0.0;
    pfVar10[1] = 0.0;
    pfVar10[2] = 0.0;
    dVar21 = 1.0 - local_c0;
    *pfVar10 = (float)((double)*local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start * dVar21 +
                      (double)*local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start * local_c0);
    pfVar10[1] = (float)((double)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[1] * dVar21 +
                        (double)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[1] * local_c0);
    pfVar10[2] = (float)((double)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[2] * dVar21 +
                        (double)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[2] * local_c0);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar10;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    hsv2rgb(&local_60,&local_48);
    *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
     _M_impl.super__Vector_impl_data._M_start =
         (uchar)(int)(*local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start * 255.999);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[1] =
         (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[1] * 255.999);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[2] =
         (uchar)(int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[2] * 255.999);
    pfVar15 = local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar17 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) goto LAB_0010a3c1;
  }
  operator_delete(pfVar10,0xc);
  operator_delete(pfVar15,(long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - (long)pfVar15);
  operator_delete(pfVar17,(long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - (long)pfVar17);
  operator_delete(pfVar9,0xc);
  uVar13 = 0xc;
LAB_0010a413:
  operator_delete(pfVar8,uVar13);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> map(double y) const
	{
		// "const" after the function name here means that this
		// method does not modify the class.

		// Almost, we need to floor result
		const float twofivesix = 255.999;

		// Map y in range [0, 1] (clipped if outside) to an RGB triple
		// in range [0, 255].

		std::vector<uint8_t> rgb(3);

		// Map out-of-range values to NaN color.
		if (y > 1.0)
		{
			rgb[0] = twofivesix * nanr;
			rgb[1] = twofivesix * nang;
			rgb[2] = twofivesix * nanb;
			return rgb;
		}

		y = std::min(std::max(y, 0.0), 1.0);

		if (inv)
			y = 1 - y;

		//// Note, using a function like sqrt here can skew the map
		//// towards the 255 end of the spectrum, while squaring can shift
		//// towards 0.
		//
		// TODO:  make an option for the exponent here.  It's useful for
		// things like black-to-red where the bright reds are
		// imperceptibly different from one another and a larger
		// exponent (e.g. 3 or 4) is helpful, while for HSV 1 is OK.
		//
		//y = sqrt(y);
		//y = y * y * y * y;
		if (paraView)
		{
			auto iter = std::lower_bound(x.begin(), x.end(), y);  // binary search
			int i = std::distance(x.begin(), iter);
			//std::cout << "i = " << i << "\n";
			//std::cout << "y = " << y << "\n";
			//std::cout << "iter = " << *iter << "\n";
			if (i > 0)
			{
				double f = (y - x[i-1]) / (x[i] - x[i-1]);
				if (space == "Diverging")
				{
					// TODO:  this may not be 100% correct, it's hard to
					// tell.  The adjustHue function described in the
					// reference may be required.  But there's only one
					// colormap in my XML files that uses this space
					// anyway.

					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto msh0 = rgb2msh(rgb0);
					auto msh1 = rgb2msh(rgb1);

					// Interpolating between an angle close to
					// +pi and an angle close to -pi should not
					// give a result near zero.
					if (abs(msh1[2] - msh0[2]) > pi)
					{
						if (msh0[2] < msh1[2])
							msh0[2] += 2 * pi;
						else
							msh1[2] += 2 * pi;
					}

					std::vector<float> msh(3);
					msh[0] = (1.0 - f) * msh0[0] + f * msh1[0];
					msh[1] = (1.0 - f) * msh0[1] + f * msh1[1];
					msh[2] = (1.0 - f) * msh0[2] + f * msh1[2];

					auto rgbf = msh2rgb(msh);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					////auto xyz0 = rgb2xyz(rgb0);
					////auto xyz  = msh2xyz(msh);
					////auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "msh0 = " << msh0 << std::endl;
					//std::cout << "msh  = " << msh  << std::endl;
					//std::cout << "msh1 = " << msh1 << std::endl;
					////std::cout << "xyz0 = " << xyz0 << std::endl;
					////std::cout << "xyz  = " << xyz  << std::endl;
					////std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "Lab")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto lab0 = rgb2lab(rgb0);
					auto lab1 = rgb2lab(rgb1);

					std::vector<float> lab(3);
					lab[0] = (1.0 - f) * lab0[0] + f * lab1[0];
					lab[1] = (1.0 - f) * lab0[1] + f * lab1[1];
					lab[2] = (1.0 - f) * lab0[2] + f * lab1[2];

					auto rgbf = lab2rgb(lab);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					//auto xyz0 = rgb2xyz(rgb0);
					//auto xyz  = lab2xyz(lab);
					//auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "lab0 = " << lab0 << std::endl;
					//std::cout << "lab  = " << lab  << std::endl;
					//std::cout << "lab1 = " << lab1 << std::endl;
					//std::cout << "xyz0 = " << xyz0 << std::endl;
					//std::cout << "xyz  = " << xyz  << std::endl;
					//std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "HSV")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto hsv0 = rgb2hsv(rgb0);
					auto hsv1 = rgb2hsv(rgb1);

					std::vector<float> hsv(3);
					hsv[0] = (1.0 - f) * hsv0[0] + f * hsv1[0];
					hsv[1] = (1.0 - f) * hsv0[1] + f * hsv1[1];
					hsv[2] = (1.0 - f) * hsv0[2] + f * hsv1[2];

					auto rgbf = hsv2rgb(hsv);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];
				}
				else  // RGB
				{
					// TODO:  add a warning for unrecognized color spaces.
					rgb[0] = twofivesix * ((1.0 - f) * r[i-1] + f * r[i]);
					rgb[1] = twofivesix * ((1.0 - f) * g[i-1] + f * g[i]);
					rgb[2] = twofivesix * ((1.0 - f) * b[i-1] + f * b[i]);
				}
			}
			else
			{
				rgb[0] = twofivesix * r[i];
				rgb[1] = twofivesix * g[i];
				rgb[2] = twofivesix * b[i];
			}
		}
		else if (0 <= imap && imap < 3)
		{
			// Black-to-(red|green|blue) map
			//            0    1     2
			rgb[imap] = y * twofivesix;
		}
		else if (3 <= imap && imap < 6)
		{
			// (cyan|magenta|yellow)-to-white map
			//    3     4       5
			rgb = {twofivefive, twofivefive, twofivefive};
			rgb[imap - 3] = y * twofivesix;
		}
		else
		{
			// HSV
			uint8_t c = twofivefive;
			double hp = 6.0 * y;
			uint8_t xu = twofivesix * (1.0 - abs(fmod(hp, 2.0) - 1.0));
			if (hp < 1.0)
				rgb = {c, xu, 0};
			else if (hp < 2.0)
				rgb = {xu, c, 0};
			else if (hp < 3.0)
				rgb = {0, c, xu};
			else if (hp < 4.0)
				rgb = {0, xu, c};
			else if (hp < 5.0)
				rgb = {xu, 0, c};
			else
				rgb = {c, 0, xu};
		}

		//std::cout << "y = " << y << "\n";
		//std::cout << "rgb = " << rgb << "\n";

		return rgb;
	}